

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# add_from_filep.c
# Opt level: O2

int main(int argc,char **argv)

{
  char *pcVar1;
  int iVar2;
  long lVar3;
  FILE *pFVar4;
  long lVar5;
  char *pcVar6;
  long lVar7;
  char *pcVar8;
  undefined8 uVar9;
  int *piVar10;
  char *pcVar11;
  char *__format;
  FILE *pFVar12;
  int err;
  zip_error_t error;
  
  prg = *argv;
  if (argc == 3) {
    pcVar1 = argv[1];
    pcVar11 = argv[2];
    lVar3 = zip_open(pcVar1,1,&err);
    if (lVar3 == 0) {
      zip_error_init_with_code(&error,err);
      pFVar12 = _stderr;
      pcVar11 = prg;
      uVar9 = zip_error_strerror(&error);
      fprintf(pFVar12,"%s: can\'t open zip archive \'%s\': %s\n",pcVar11,pcVar1,uVar9);
      zip_error_fini(&error);
    }
    else {
      pFVar4 = fopen(pcVar11,"rb");
      pFVar12 = _stderr;
      pcVar6 = prg;
      if (pFVar4 == (FILE *)0x0) {
        piVar10 = __errno_location();
        pcVar8 = strerror(*piVar10);
        __format = "%s: can\'t open input file \'%s\': %s\n";
      }
      else {
        lVar5 = zip_source_filep(lVar3,pFVar4,0,0xffffffffffffffff);
        pFVar12 = _stderr;
        pcVar6 = prg;
        if (lVar5 == 0) {
          pcVar8 = (char *)zip_strerror(lVar3);
          __format = "%s: error creating file source for \'%s\': %s\n";
        }
        else {
          pcVar6 = strrchr(pcVar11,0x2f);
          if (pcVar6 == (char *)0x0) {
            pcVar6 = pcVar11;
          }
          lVar7 = zip_add(lVar3,pcVar6,lVar5);
          if (lVar7 == -1) {
            zip_source_free(lVar5);
            pFVar12 = _stderr;
            pcVar6 = prg;
            pcVar8 = (char *)zip_strerror(lVar3);
            __format = "%s: can\'t add file \'%s\': %s\n";
          }
          else {
            iVar2 = zip_close(lVar3);
            pFVar12 = _stderr;
            pcVar6 = prg;
            if (iVar2 != -1) {
              return 0;
            }
            pcVar8 = (char *)zip_strerror(lVar3);
            __format = "%s: can\'t close zip archive \'%s\': %s\n";
            pcVar11 = pcVar1;
          }
        }
      }
      fprintf(pFVar12,__format,pcVar6,pcVar11,pcVar8);
    }
  }
  else {
    fprintf(_stderr,"usage: %s archive file\n");
  }
  return 1;
}

Assistant:

int
main(int argc, char *argv[]) {
    const char *archive;
    const char *file;
    const char *name;
    zip_t *za;
    zip_source_t *zs;
    int err;
    FILE *fp;

    prg = argv[0];

    if (argc != 3) {
	fprintf(stderr, "usage: %s archive file\n", prg);
	return 1;
    }

    archive = argv[1];
    file = argv[2];

    if ((za = zip_open(archive, ZIP_CREATE, &err)) == NULL) {
	zip_error_t error;
	zip_error_init_with_code(&error, err);
	fprintf(stderr, "%s: can't open zip archive '%s': %s\n", prg, archive, zip_error_strerror(&error));
	zip_error_fini(&error);
	return 1;
    }

    if ((fp = fopen(file, "rb")) == NULL) {
	fprintf(stderr, "%s: can't open input file '%s': %s\n", prg, file, strerror(errno));
	return 1;
    }

    if ((zs = zip_source_filep(za, fp, 0, -1)) == NULL) {
	fprintf(stderr, "%s: error creating file source for '%s': %s\n", prg, file, zip_strerror(za));
	return 1;
    }

    if ((name = strrchr(file, '/')) == NULL)
	name = file;

    if (zip_add(za, name, zs) == -1) {
	zip_source_free(zs);
	fprintf(stderr, "%s: can't add file '%s': %s\n", prg, file, zip_strerror(za));
	return 1;
    }

    if (zip_close(za) == -1) {
	fprintf(stderr, "%s: can't close zip archive '%s': %s\n", prg, archive, zip_strerror(za));
	return 1;
    }

    return 0;
}